

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void Commands::Quake(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *arguments,Character *from)

{
  size_type sVar1;
  const_reference subject;
  int *piVar2;
  int local_28 [4];
  Character *pCStack_18;
  int strength;
  Character *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  local_28[3] = 5;
  pCStack_18 = from;
  from_local = (Character *)arguments;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(arguments);
  if (sVar1 != 0) {
    local_28[2] = 1;
    local_28[1] = 8;
    subject = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)from_local,0);
    local_28[0] = util::to_int(subject);
    piVar2 = std::min<int>(local_28 + 1,local_28);
    piVar2 = std::max<int>(local_28 + 2,piVar2);
    local_28[3] = *piVar2;
  }
  Map::Effect(pCStack_18->map,MAP_EFFECT_QUAKE,(uchar)local_28[3]);
  return;
}

Assistant:

void Quake(const std::vector<std::string>& arguments, Character* from)
{
	int strength = 5;

	if (arguments.size() >= 1)
		strength = std::max(1, std::min(8, util::to_int(arguments[0])));

	from->map->Effect(MAP_EFFECT_QUAKE, strength);
}